

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osifcnet.cpp
# Opt level: O0

size_t urlencodestr(char *dst,char *str)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  size_t len;
  size_t local_18;
  char *local_10;
  char *local_8;
  
  local_18 = 0;
  local_8 = in_RDI;
  for (local_10 = in_RSI; *local_10 != '\0'; local_10 = local_10 + 1) {
    iVar1 = (int)*local_10;
    if (iVar1 == 0x20) {
      local_18 = local_18 + 1;
      if (local_8 != (char *)0x0) {
        *local_8 = '+';
        local_8 = local_8 + 1;
      }
    }
    else if ((((((iVar1 == 0x21) || (iVar1 - 0x23U < 2)) || (iVar1 - 0x26U < 7)) ||
              ((iVar1 == 0x2f || (iVar1 - 0x3aU < 2)))) ||
             ((iVar1 == 0x3d || ((iVar1 - 0x3fU < 2 || (iVar1 == 0x5b)))))) || (iVar1 == 0x5d)) {
      local_18 = local_18 + 3;
      if (local_8 != (char *)0x0) {
        sprintf(local_8,"%%%02x",(ulong)(uint)(int)*local_10);
        local_8 = local_8 + 3;
      }
    }
    else {
      local_18 = local_18 + 1;
      if (local_8 != (char *)0x0) {
        *local_8 = *local_10;
        local_8 = local_8 + 1;
      }
    }
  }
  if (local_8 != (char *)0x0) {
    *local_8 = '\0';
  }
  return local_18;
}

Assistant:

static size_t urlencodestr(char *dst, const char *str)
{
    size_t len;
    for (len = 0 ; *str != '\0' ; ++str)
    {
        switch (*str)
        {
        case '!':
        case '*':
        case '\'':
        case '(':
        case ')':
        case ';':
        case ':':
        case '@':
        case '&':
        case '=':
        case '+':
        case '$':
        case ',':
        case '/':
        case '?':
        case '#':
        case '[':
        case ']':
            /* encode these as % sequences */
            len += 3;
            if (dst != 0)
            {
                sprintf(dst, "%%%02x", (int)*str);
                dst += 3;
            }
            break;

        case ' ':
            /* encode space as '+' */
            ++len;
            if (dst != 0)
                *dst++ = '+';
            break;

        default:
            /* encode anything else as-is */
            ++len;
            if (dst != 0)
                *dst++ = *str;
            break;
        }
    }

    /* add a null terminator (but don't count it in the output length) */
    if (dst != 0)
        *dst = '\0';

    /* return the calculated length */
    return len;
}